

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_apu.c
# Opt level: O2

void NES_APU_np_Reset(void *chip)

{
  NES_APU *apu;
  int iVar1;
  
  *(undefined4 *)((long)chip + 0x2c) = 0;
  *(undefined4 *)((long)chip + 0x18) = 0;
  *(undefined8 *)((long)chip + 0xe0) = 0;
  *(undefined4 *)((long)chip + 0xe8) = 0;
  *(undefined8 *)((long)chip + 0x120) = 0x100000001;
  *(undefined8 *)((long)chip + 0x140) = 0;
  *(undefined8 *)((long)chip + 0x148) = 0;
  *(undefined8 *)((long)chip + 0x150) = 0;
  for (iVar1 = -8; iVar1 != 0; iVar1 = iVar1 + 1) {
    NES_APU_np_Write(chip,(short)iVar1 + 0x4008,'\0');
  }
  *(undefined1 *)((long)chip + 0x45) = 0;
  *(undefined2 *)((long)chip + 0x158) = 0;
  *(undefined8 *)((long)chip + 0x150) = 0;
  if (*(int *)((long)chip + 8) != 0) {
    *(undefined2 *)((long)chip + 0x158) = 0x101;
    *(undefined1 *)((long)chip + 0x45) = 0xf;
  }
  *(undefined8 *)((long)chip + 0x50) = 0;
  NES_APU_np_SetRate(chip,*(UINT32 *)((long)chip + 0x58));
  *(undefined8 *)((long)chip + 0x168) = 0;
  return;
}

Assistant:

void NES_APU_np_Reset(void* chip)
{
	NES_APU* apu = (NES_APU*)chip;
	int i;
	apu->gclock = 0;
	apu->mask = 0;

	apu->scounter[0] = 0;
	apu->scounter[1] = 0;
	apu->sphase[0] = 0;
	apu->sphase[0] = 0;

	apu->sweep_div[0] = 1;
	apu->sweep_div[1] = 1;
	apu->envelope_div[0] = 0;
	apu->envelope_div[1] = 0;
	apu->length_counter[0] = 0;
	apu->length_counter[1] = 0;
	apu->envelope_counter[0] = 0;
	apu->envelope_counter[1] = 0;

	for (i = 0x4000; i < 0x4008; i++)
		NES_APU_np_Write(apu, i, 0);

	NES_APU_np_Write(apu, 0x4015, 0);
	if (apu->option[OPT_UNMUTE_ON_RESET])
		NES_APU_np_Write(apu, 0x4015, 0x0f);

	for (i = 0; i < 2; i++)
		apu->out[i] = 0;

	NES_APU_np_SetRate(apu, apu->rate);
	RC_RESET(&apu->tick_count);
}